

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.cpp
# Opt level: O1

string * __thiscall
pbrt::FilterSampler::ToString_abi_cxx11_(string *__return_storage_ptr__,FilterSampler *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::
  stringPrintfRecursive<pbrt::Bounds2<float>const&,pbrt::Array2D<float>const&,pbrt::PiecewiseConstant2D_const&>
            (__return_storage_ptr__,"[ FilterSampler domain: %s values: %s distrib: %s ]",
             &this->domain,&this->values,&this->distrib);
  return __return_storage_ptr__;
}

Assistant:

std::string FilterSampler::ToString() const {
    return StringPrintf("[ FilterSampler domain: %s values: %s distrib: %s ]", domain,
                        values, distrib);
}